

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O0

int Spl_ManCountMarkedFanins(Gia_Man_t *p,int iObj,Vec_Bit_t *vMarks)

{
  int iVar1;
  Vec_Int_t *p_00;
  Vec_Int_t *vFanins;
  int Count;
  int iFan;
  int i;
  Vec_Bit_t *vMarks_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  vFanins._4_4_ = 0;
  p_00 = Gia_ObjLutFanins2(p,iObj);
  for (Count = 0; iVar1 = Vec_IntSize(p_00), Count < iVar1; Count = Count + 1) {
    iVar1 = Vec_IntEntry(p_00,Count);
    iVar1 = Vec_BitEntry(vMarks,iVar1);
    if (iVar1 != 0) {
      vFanins._4_4_ = vFanins._4_4_ + 1;
    }
  }
  return vFanins._4_4_;
}

Assistant:

int Spl_ManCountMarkedFanins( Gia_Man_t * p, int iObj, Vec_Bit_t * vMarks )
{
    int i, iFan, Count = 0;
    Vec_Int_t * vFanins = Gia_ObjLutFanins2(p, iObj);
    Vec_IntForEachEntry( vFanins, iFan, i )
        if ( Vec_BitEntry(vMarks, iFan) )
            Count++;
    return Count;
}